

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void update_index(storage_t *st,bool checkpointing)

{
  void *start_key;
  long lVar1;
  fdb_status fVar2;
  int iVar3;
  byte in_SIL;
  long in_RDI;
  char rbuf [256];
  char *maxk;
  char *mink;
  size_t vallen;
  int n;
  fdb_status status;
  fdb_doc *rdoc;
  person_t *p;
  fdb_iterator *it;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 in_stack_fffffffffffffe5c;
  fdb_iterator *in_stack_fffffffffffffe68;
  size_t *in_stack_fffffffffffffe78;
  void **in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  void *in_stack_fffffffffffffe90;
  fdb_kvs_handle *in_stack_fffffffffffffe98;
  storage_t *in_stack_fffffffffffffed0;
  fdb_iterator *in_stack_fffffffffffffed8;
  person_t *in_stack_fffffffffffffee8;
  storage_t *in_stack_fffffffffffffef0;
  uint local_80;
  fdb_iterator *local_68 [5];
  __time_t local_40;
  __suseconds_t local_38;
  timeval local_20;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  local_40 = local_20.tv_sec;
  local_38 = local_20.tv_usec;
  local_80 = 0;
  start_key = *(void **)(local_8 + 0x40);
  lVar1 = *(long *)(local_8 + 0x40);
  reset_storage_index((storage_t *)0x103be8);
  if ((local_9 & 1) != 0) {
    start_checkpoint(in_stack_fffffffffffffed0);
  }
  uVar4 = 2;
  uVar5 = 0;
  fVar2 = fdb_iterator_init(*(fdb_kvs_handle **)(local_8 + 0x10),local_68,start_key,0xc,
                            (void *)(lVar1 + 0xc),0xc,2);
  if ((fVar2 != FDB_RESULT_SUCCESS) && (fVar2 != FDB_RESULT_ITERATOR_FAIL)) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
            ,0x77);
    update_index::__test_pass = 0;
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x77,"void update_index(storage_t *, bool)");
    }
  }
  do {
    fVar2 = fdb_iterator_get(in_stack_fffffffffffffed8,(fdb_doc **)in_stack_fffffffffffffed0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_kv(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                         in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        iVar3 = strcmp((char *)0xe00,(char *)(local_8 + 0x48));
        if (iVar3 == 0) {
          e2e_fdb_del_person(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          local_80 = local_80 + 1;
        }
        free((void *)0x0);
      }
      fdb_doc_free((fdb_doc *)0x103d97);
    }
    fVar2 = fdb_iterator_next((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffe5c,CONCAT22(uVar5,uVar4)));
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if ((local_9 & 1) != 0) {
    end_checkpoint(in_stack_fffffffffffffed0);
  }
  fdb_iterator_close(in_stack_fffffffffffffe68);
  *(undefined4 *)(*(long *)(local_8 + 0x38) + 0x404) = 0;
  *(undefined4 *)(*(long *)(local_8 + 0x38) + 0x408) = 0;
  sprintf(&stack0xfffffffffffffe68,"update index: %03d docs deleted",(ulong)local_80);
  return;
}

Assistant:

void update_index(storage_t *st, bool checkpointing) {

    TEST_INIT();

    fdb_iterator *it;
    person_t *p = NULL;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    int n = 0;
    size_t vallen;
    char *mink = st->index_params->min;
    char *maxk = st->index_params->max;
    char rbuf[256];

    // change storage index range
    reset_storage_index(st);

    if (checkpointing) {
        start_checkpoint(st);
    }
    status = fdb_iterator_init(st->index1, &it, mink, 12,
                               maxk, 12, FDB_ITR_NO_DELETES);
    if (status != FDB_RESULT_SUCCESS) {
        // no items within min max range
        TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    }



    do {
        status = fdb_iterator_get(it, &rdoc);
        if (status == FDB_RESULT_SUCCESS) {
            status = fdb_get_kv(st->all_docs,
                                rdoc->body, rdoc->bodylen,
                                (void **)&p, &vallen);
            if (status == FDB_RESULT_SUCCESS) {
                if (strcmp(p->keyspace, st->keyspace) == 0) {
                    e2e_fdb_del_person(st, p);
                    n++;
                }
                free(p);
                p=NULL;
            }
            fdb_doc_free(rdoc);
            rdoc=NULL;
        }
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);

    if (checkpointing) {
        end_checkpoint(st);
    }

    fdb_iterator_close(it);

    // reset verification chkpoint
    st->v_chk->num_indexed = 0;
    st->v_chk->sum_age_indexed = 0;

    sprintf(rbuf, "update index: %03d docs deleted", n);
#ifdef __DEBUG_E2E
    TEST_RESULT(rbuf);
#endif
}